

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<double,(unsigned_char)2>,double>
          (Thread *this,Instr instr)

{
  double dVar1;
  double *pdVar2;
  undefined1 local_28 [8];
  Simd<double,_(unsigned_char)__x02_> simd;
  double val;
  Thread *this_local;
  
  simd.v[1] = Pop<double>(this);
  _local_28 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  dVar1 = simd.v[1];
  pdVar2 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                     ((Simd<double,_(unsigned_char)__x02_> *)local_28,instr.field_2.imm_u8);
  *pdVar2 = dVar1;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,_local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}